

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP5Reader::PerformRemoteGets(BP5Reader *this)

{
  size_type __n;
  element_type *peVar1;
  undefined8 *puVar2;
  Remote *pRVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer ppvVar5;
  mutex *__mutex;
  int iVar6;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Result<bool> *p_Var8;
  future<bool> *f;
  _State_baseV2 *__tmp_1;
  pointer pBVar9;
  ulong uVar10;
  long lVar11;
  _State_baseV2 *__tmp;
  pointer ppvVar12;
  ulong uVar13;
  bool bVar14;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  long *local_100;
  vector<void_*,_std::allocator<void_*>_> handles;
  size_t nHandles;
  anon_class_24_3_72065bc4 lf_GetNextHandle;
  __basic_future<bool> local_b8;
  ulong local_a8;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> futures;
  _func_int **local_88 [2];
  size_t nextHandle;
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  GetRequests;
  mutex mutexReadRequests;
  
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::vector(&GetRequests,&this->m_BP5Deserializer->PendingGetRequests);
  handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (GetRequests.
      super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      GetRequests.
      super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar9 = GetRequests.
             super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pRVar3 = (this->m_Remote)._M_t.
               super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
               super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
               super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
      iVar6 = (*pRVar3->_vptr_Remote[5])
                        (pRVar3,pBVar9->VarName,pBVar9->RelStep,pBVar9->StepCount,pBVar9->BlockID,
                         &pBVar9->Count,&pBVar9->Start,*(long *)((long)pBVar9->VarRec + 8) + 0x128,
                         pBVar9->Data);
      mutexReadRequests.super___mutex_base._M_mutex.__align = CONCAT44(extraout_var,iVar6);
      if (handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&handles,
                   (iterator)
                   handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(void **)&mutexReadRequests);
      }
      else {
        *handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
         ._M_finish = (void *)mutexReadRequests.super___mutex_base._M_mutex.__align;
        handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      pBVar9 = pBVar9 + 1;
    } while (pBVar9 != GetRequests.
                       super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppvVar5 = handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  nHandles = (long)handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  lf_GetNextHandle.nHandles = &nHandles;
  lf_GetNextHandle.nextHandle = &nextHandle;
  nextHandle = 0;
  lf_GetNextHandle.mutexReadRequests = &mutexReadRequests;
  mutexReadRequests.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  mutexReadRequests.super___mutex_base._M_mutex._16_8_ = 0;
  mutexReadRequests.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  mutexReadRequests.super___mutex_base._M_mutex.__align = 0;
  mutexReadRequests.super___mutex_base._M_mutex._8_8_ = 0;
  uVar10 = (ulong)this->m_Threads;
  ppvVar12 = handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((uVar10 < 2) || (nHandles < 2)) {
    for (; ppvVar12 != ppvVar5; ppvVar12 = ppvVar12 + 1) {
      pRVar3 = (this->m_Remote)._M_t.
               super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
               super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
               super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
      (*pRVar3->_vptr_Remote[6])(pRVar3,*ppvVar12);
    }
  }
  else {
    local_a8 = uVar10;
    if (nHandles < uVar10) {
      local_a8 = nHandles;
    }
    __n = local_a8 - 1;
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
              (&futures,__n,(allocator_type *)&__state);
    if (__n != 0) {
      uVar10 = 1;
      lVar11 = 8;
      do {
        __state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        __state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
        p_Var7->_M_use_count = 1;
        p_Var7->_M_weak_count = 1;
        p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0087f8f0;
        peVar1 = (element_type *)(p_Var7 + 1);
        p_Var7[2]._M_use_count = 0;
        p_Var7[1]._M_use_count = 0;
        p_Var7[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var7[1]._M_weak_count + 1) = 0;
        p_Var7[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var7[3]._M_use_count = 0;
        p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0087f940;
        p_Var8 = (_Result<bool> *)operator_new(0x18);
        std::__future_base::_Result<bool>::_Result(p_Var8);
        p_Var7[4]._vptr__Sp_counted_base = (_func_int **)p_Var8;
        p_Var7[4]._M_use_count = (int)uVar10;
        p_Var7[4]._M_weak_count = (int)(uVar10 >> 0x20);
        p_Var7[5]._vptr__Sp_counted_base = (_func_int **)&lf_GetNextHandle;
        *(size_t **)&p_Var7[5]._M_use_count = &nHandles;
        p_Var7[6]._vptr__Sp_counted_base = (_func_int **)this;
        *(vector<void_*,_std::allocator<void_*>_> **)&p_Var7[6]._M_use_count = &handles;
        local_88[0] = (_func_int **)0x0;
        local_100 = (long *)operator_new(0x20);
        *local_100 = (long)&PTR___State_0087f998;
        local_100[1] = (long)peVar1;
        local_100[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>,_bool>
                             ::_M_run;
        local_100[3] = 0;
        std::thread::_M_start_thread(local_88,&local_100,0);
        if (local_100 != (long *)0x0) {
          (**(code **)(*local_100 + 8))();
        }
        _Var4._M_pi = __state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        if (p_Var7[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        p_Var7[3]._vptr__Sp_counted_base = local_88[0];
        bVar14 = __state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar1;
        __state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var7;
        if (bVar14) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
        }
        if (__state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          p_Var7->_M_use_count = 1;
          p_Var7->_M_weak_count = 1;
          p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0087f9d8;
          p_Var7[2]._M_use_count = 0;
          p_Var7[1]._M_use_count = 0;
          p_Var7[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var7[1]._M_weak_count + 1) = 0;
          p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_0087fa28;
          p_Var8 = (_Result<bool> *)operator_new(0x18);
          std::__future_base::_Result<bool>::_Result(p_Var8);
          _Var4 = __state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          p_Var7[3]._vptr__Sp_counted_base = (_func_int **)p_Var8;
          p_Var7[3]._M_use_count = (int)uVar10;
          p_Var7[3]._M_weak_count = (int)(uVar10 >> 0x20);
          p_Var7[4]._vptr__Sp_counted_base = (_func_int **)&lf_GetNextHandle;
          *(size_t **)&p_Var7[4]._M_use_count = &nHandles;
          p_Var7[5]._vptr__Sp_counted_base = (_func_int **)this;
          *(vector<void_*,_std::allocator<void_*>_> **)&p_Var7[5]._M_use_count = &handles;
          bVar14 = __state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          __state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(p_Var7 + 1);
          __state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var7;
          if (bVar14) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
          }
        }
        std::__basic_future<bool>::__basic_future(&local_b8,&__state);
        if (__state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (__state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        _Var4._M_pi = local_b8._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        peVar1 = local_b8._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_b8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_b8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&((futures.
                            super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super___basic_future<bool>).
                          _M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + lVar11);
        puVar2 = (undefined8 *)
                 ((long)futures.
                        super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
        *puVar2 = peVar1;
        puVar2[1] = _Var4._M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        if (local_b8._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x10;
      } while (local_a8 != uVar10);
    }
    while( true ) {
      __mutex = lf_GetNextHandle.mutexReadRequests;
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)lf_GetNextHandle.mutexReadRequests);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      uVar10 = *lf_GetNextHandle.nextHandle;
      uVar13 = 0xffffffffffffffff;
      if (uVar10 < *lf_GetNextHandle.nHandles) {
        *lf_GetNextHandle.nextHandle = uVar10 + 1;
        uVar13 = uVar10;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (nHandles < uVar13) break;
      pRVar3 = (this->m_Remote)._M_t.
               super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
               super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
               super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
      (*pRVar3->_vptr_Remote[6])
                (pRVar3,handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13]);
    }
    for (; futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
        futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
             _M_impl.super__Vector_impl_data._M_start + 1) {
      std::future<bool>::get
                (futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector(&futures);
  }
  if (handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::~vector(&GetRequests);
  return;
}

Assistant:

void BP5Reader::PerformRemoteGets()
{
    // TP startGenerate = NOW();
    auto GetRequests = m_BP5Deserializer->PendingGetRequests;
    std::vector<Remote::GetHandle> handles;
    for (auto &Req : GetRequests)
    {
        VariableBase *VB = m_BP5Deserializer->GetVariableBaseFromBP5VarRec(Req.VarRec);
        auto handle = m_Remote->Get(Req.VarName, Req.RelStep, Req.StepCount, Req.BlockID, Req.Count,
                                    Req.Start, VB->m_AccuracyRequested, Req.Data);
        handles.push_back(handle);
    }

    size_t nHandles = handles.size();
    // TP endGenerate = NOW();
    // double generateTime = DURATION(startGenerate, endGenerate);

    size_t nextHandle = 0;
    std::mutex mutexReadRequests;

    auto lf_GetNextHandle = [&]() -> size_t {
        std::lock_guard<std::mutex> lockGuard(mutexReadRequests);
        size_t reqidx = MaxSizeT;
        if (nextHandle < nHandles)
        {
            reqidx = nextHandle;
            ++nextHandle;
        }
        return reqidx;
    };

    auto lf_WaitForGet = [&](const size_t threadID) -> bool {
        while (true)
        {
            const auto reqidx = lf_GetNextHandle();
            if (reqidx > nHandles)
            {
                break;
            }
            m_Remote->WaitForGet(handles[reqidx]);
            // std::cout << "BP5Reader::PerformRemoteGets: thread " << threadID
            //           << " done with response " << reqidx << std::endl;
        }
        return true;
    };

    if (m_Threads > 1 && nHandles > 1)
    {
        size_t nThreads = (m_Threads < nHandles ? m_Threads : nHandles);
        std::vector<std::future<bool>> futures(nThreads - 1);

        // launch Threads-1 threads to process subsets of handles,
        // then main thread process the last subset
        for (size_t tid = 0; tid < nThreads - 1; ++tid)
        {
            futures[tid] = std::async(std::launch::async, lf_WaitForGet, tid + 1);
        }

        // main thread runs last subset of reads
        lf_WaitForGet(0);

        // wait for all async threads
        for (auto &f : futures)
        {
            f.get();
        }
    }
    else
    {
        for (auto &handle : handles)
        {
            m_Remote->WaitForGet(handle);
        }
    }
}